

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6d004::SymlinkCommand::execute
          (SymlinkCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          ResultFn *resultFn)

{
  path *this_00;
  _func_int *p_Var1;
  undefined8 *puVar2;
  char cVar3;
  string *psVar4;
  char *pcVar5;
  BuildEngineDelegate *pBVar6;
  long *plVar7;
  uint64_t *puVar8;
  pointer ppBVar9;
  long *plVar10;
  char *pcVar11;
  ArrayRef<llbuild::basic::FileInfo> outputInfos;
  StringRef SVar12;
  FileInfo outputInfo;
  BuildValue local_138;
  BuildSystem *local_c8;
  _Any_data *local_c0;
  void *local_b8;
  void *local_b0;
  string *local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  FileInfo local_80;
  
  pcVar11 = (char *)(this->linkOutputPath)._M_string_length;
  if (pcVar11 == (char *)0x0) {
    ppBVar9 = (this->super_Command).outputs.
              super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar11 = (char *)((*ppBVar9)->super_Node).name._M_string_length;
    psVar4 = &((*ppBVar9)->super_Node).name;
  }
  else {
    psVar4 = &this->linkOutputPath;
    ppBVar9 = (this->super_Command).outputs.
              super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pcVar11 == (char *)0x0 ||
      ppBVar9 ==
      (this->super_Command).outputs.
      super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_138.kind = FailedCommand;
    local_138.numOutputInfos = 0;
    local_138._0_8_ = (undefined8 *)0xb;
    local_138.signature.value._0_4_ = 0;
    local_138.signature.value._4_4_ = 0;
    local_138.valueData.asOutputInfo.device._0_4_ = 0;
    local_138.valueData.asOutputInfo.device._4_4_ = 0;
    local_138.valueData.asOutputInfo.inode._0_4_ = 0;
    local_138.valueData._12_8_ = 0;
    local_138.valueData._20_8_ = 0;
    local_138.valueData._28_8_ = 0;
    local_138.valueData._36_8_ = 0;
    local_138.valueData._44_8_ = 0;
    local_138.valueData._52_8_ = 0;
    local_138.valueData._60_8_ = 0;
    local_138.valueData._68_8_ = 0;
    local_138.valueData._76_4_ = 0;
    local_138.stringValues.contents._0_4_ = 0;
    local_138.stringValues.contents._4_4_ = 0;
    local_138.stringValues.size = 0;
    if ((resultFn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0011e0b7;
    (*resultFn->_M_invoker)((_Any_data *)resultFn,&local_138);
    goto LAB_0011e09d;
  }
  this_00 = (path *)(psVar4->_M_dataplus)._M_p;
  plVar7 = *(long **)((long)system->impl + 0x10);
  SVar12.Length = 2;
  SVar12.Data = pcVar11;
  local_c0 = (_Any_data *)resultFn;
  local_b8 = ti.impl;
  local_b0 = ti.ctx;
  SVar12 = llvm::sys::path::parent_path(this_00,SVar12,(Style)ti.ctx);
  pcVar5 = SVar12.Data;
  local_c8 = system;
  if (SVar12.Length != 0) {
    puVar2 = (undefined8 *)&local_138.valueData;
    local_138._0_8_ = puVar2;
    if (pcVar5 == (char *)0x0) {
      local_138.signature.value._0_4_ = 0;
      local_138.signature.value._4_4_ = 0;
      local_138.valueData.asOutputInfo.device._0_4_ =
           local_138.valueData.asOutputInfo.device._0_4_ & 0xffffff00;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,pcVar5,pcVar5 + SVar12.Length);
    }
    (**(code **)(*plVar7 + 0x18))(plVar7,&local_138);
    if ((undefined8 *)local_138._0_8_ != puVar2) {
      operator_delete((void *)local_138._0_8_,
                      CONCAT44(local_138.valueData.asOutputInfo.device._4_4_,
                               local_138.valueData.asOutputInfo.device._0_4_) + 1);
    }
  }
  plVar10 = *(long **)((long)local_c8->impl + 8);
  (**(code **)(*plVar10 + 0x50))(plVar10,this);
  local_a8 = &this->contents;
  local_138._0_8_ = &local_138.valueData;
  if (this_00 == (path *)0x0) {
    local_138.signature.value._0_4_ = 0;
    local_138.signature.value._4_4_ = 0;
    local_138.valueData.asOutputInfo.device._0_4_ =
         local_138.valueData.asOutputInfo.device._0_4_ & 0xffffff00;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,this_00,pcVar11 + (long)this_00);
  }
  cVar3 = (**(code **)(*plVar7 + 0x48))(plVar7,local_a8,&local_138);
  puVar2 = (undefined8 *)&local_138.valueData;
  if ((undefined8 *)local_138._0_8_ != puVar2) {
    operator_delete((void *)local_138._0_8_,
                    CONCAT44(local_138.valueData.asOutputInfo.device._4_4_,
                             local_138.valueData.asOutputInfo.device._0_4_) + 1);
  }
  if (cVar3 == '\0') {
    local_138._0_8_ = puVar2;
    if (this_00 == (path *)0x0) {
      local_138.signature.value._0_4_ = 0;
      local_138.signature.value._4_4_ = 0;
      local_138.valueData.asOutputInfo.device._0_4_ =
           local_138.valueData.asOutputInfo.device._0_4_ & 0xffffff00;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,this_00,pcVar11 + (long)this_00);
    }
    (**(code **)(*plVar7 + 0x28))(plVar7,&local_138);
    if ((undefined8 *)local_138._0_8_ != puVar2) {
      operator_delete((void *)local_138._0_8_,
                      CONCAT44(local_138.valueData.asOutputInfo.device._4_4_,
                               local_138.valueData.asOutputInfo.device._0_4_) + 1);
    }
    psVar4 = local_a8;
    if (this_00 == (path *)0x0) {
      local_138.signature.value._0_4_ = 0;
      local_138.signature.value._4_4_ = 0;
      local_138.valueData.asOutputInfo.device._0_4_ =
           local_138.valueData.asOutputInfo.device._0_4_ & 0xffffff00;
    }
    else {
      local_138._0_8_ = puVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,this_00,pcVar11 + (long)this_00);
      puVar2 = (undefined8 *)local_138._0_8_;
    }
    local_138._0_8_ = puVar2;
    cVar3 = (**(code **)(*plVar7 + 0x48))(plVar7,psVar4,&local_138);
    if ((anon_union_80_2_ecfed234_for_valueData *)local_138._0_8_ != &local_138.valueData) {
      operator_delete((void *)local_138._0_8_,
                      CONCAT44(local_138.valueData.asOutputInfo.device._4_4_,
                               local_138.valueData.asOutputInfo.device._0_4_) + 1);
    }
    if (cVar3 != '\0') goto LAB_0011de21;
    local_138.kind = (Kind)local_b8;
    local_138.numOutputInfos = (uint32_t)((ulong)local_b8 >> 0x20);
    local_138.signature.value._0_4_ = SUB84(local_b0,0);
    local_138.signature.value._4_4_ = (undefined4)((ulong)local_b0 >> 0x20);
    pBVar6 = llbuild::core::TaskInterface::delegate((TaskInterface *)&local_138);
    p_Var1 = pBVar6[1]._vptr_BuildEngineDelegate[1];
    local_a0 = &local_90;
    if (this_00 == (path *)0x0) {
      local_98 = 0;
      local_90 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,this_00,pcVar11 + (long)this_00);
    }
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x19f3c1);
    puVar8 = (uint64_t *)(plVar7 + 2);
    if ((uint64_t *)*plVar7 == puVar8) {
      local_80.mode = *puVar8;
      local_80.size = plVar7[3];
      local_80.device = (uint64_t)&local_80.mode;
    }
    else {
      local_80.mode = *puVar8;
      local_80.device = (uint64_t)*plVar7;
    }
    local_80.inode = plVar7[1];
    *plVar7 = (long)puVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
    plVar10 = plVar7 + 2;
    if ((long *)*plVar7 == plVar10) {
      local_138.valueData.asOutputInfo.device._0_4_ = (undefined4)*plVar10;
      local_138.valueData.asOutputInfo.device._4_4_ = *(undefined4 *)((long)plVar7 + 0x14);
      local_138.valueData.asOutputInfo.inode._0_4_ = (undefined4)plVar7[3];
      local_138.valueData.asOutputInfo.inode._4_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
      local_138._0_8_ = &local_138.valueData;
    }
    else {
      local_138.valueData.asOutputInfo.device._0_4_ = (undefined4)*plVar10;
      local_138.valueData.asOutputInfo.device._4_4_ = (undefined4)((ulong)*plVar10 >> 0x20);
      local_138._0_8_ = (long *)*plVar7;
    }
    local_138.signature.value._0_4_ = (undefined4)plVar7[1];
    local_138.signature.value._4_4_ = (undefined4)((ulong)plVar7[1] >> 0x20);
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    (**(code **)(*(long *)p_Var1 + 0x58))(p_Var1,this,local_138._0_8_);
    if ((anon_union_80_2_ecfed234_for_valueData *)local_138._0_8_ != &local_138.valueData) {
      operator_delete((void *)local_138._0_8_,
                      CONCAT44(local_138.valueData.asOutputInfo.device._4_4_,
                               local_138.valueData.asOutputInfo.device._0_4_) + 1);
    }
    if ((uint64_t *)local_80.device != &local_80.mode) {
      operator_delete((void *)local_80.device,local_80.mode + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
    }
    plVar7 = *(long **)((long)local_c8->impl + 8);
    (**(code **)(*plVar7 + 0x70))(plVar7,this,1);
    local_138._0_8_ = (undefined8 *)0xb;
    local_138.signature.value._0_4_ = 0;
    local_138.signature.value._4_4_ = 0;
    local_138.valueData.asOutputInfo.device._0_4_ = 0;
    local_138.valueData.asOutputInfo.device._4_4_ = 0;
    local_138.valueData.asOutputInfo.inode._0_4_ = 0;
    local_138.valueData._12_8_ = 0;
    local_138.valueData._20_8_ = 0;
    local_138.valueData._28_8_ = 0;
    local_138.valueData._36_8_ = 0;
    local_138.valueData._44_8_ = 0;
    local_138.valueData._52_8_ = 0;
    local_138.valueData._60_8_ = 0;
    local_138.valueData._68_8_ = 0;
    local_138.valueData._76_4_ = 0;
    local_138.stringValues.contents._0_4_ = 0;
    local_138.stringValues.contents._4_4_ = 0;
    local_138.stringValues.size = 0;
  }
  else {
LAB_0011de21:
    plVar10 = *(long **)((long)local_c8->impl + 8);
    (**(code **)(*plVar10 + 0x70))(plVar10,this,0);
    puVar2 = (undefined8 *)&local_138.valueData;
    local_138._0_8_ = puVar2;
    if (this_00 == (path *)0x0) {
      local_138.signature.value._0_4_ = 0;
      local_138.signature.value._4_4_ = 0;
      local_138.valueData.asOutputInfo.device._0_4_ =
           local_138.valueData.asOutputInfo.device._0_4_ & 0xffffff00;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,this_00,pcVar11 + (long)this_00);
    }
    (**(code **)(*plVar7 + 0x40))(&local_80,plVar7,&local_138);
    if ((undefined8 *)local_138._0_8_ != puVar2) {
      operator_delete((void *)local_138._0_8_,
                      CONCAT44(local_138.valueData.asOutputInfo.device._4_4_,
                               local_138.valueData.asOutputInfo.device._0_4_) + 1);
    }
    outputInfos.Length = 1;
    outputInfos.Data = &local_80;
    llbuild::buildsystem::BuildValue::BuildValue
              (&local_138,SuccessfulCommand,outputInfos,(CommandSignature)0x0);
  }
  if (*(long *)(local_c0 + 1) == 0) {
LAB_0011e0b7:
    std::__throw_bad_function_call();
  }
  (**(code **)(local_c0->_M_pod_data + 0x18))(local_c0,&local_138);
LAB_0011e09d:
  llbuild::buildsystem::BuildValue::~BuildValue(&local_138);
  return;
}

Assistant:

virtual void execute(BuildSystem& system,
                       TaskInterface ti,
                       QueueJobContext* context,
                       ResultFn resultFn) override {
    // It is an error if this command isn't configured properly.
    StringRef outputPath = getActualOutputPath();
    if (outputs.empty() || outputPath.empty()) {
      resultFn(BuildValue::makeFailedCommand());
      return;
    }

    auto& fs = system.getFileSystem();

    // Create the directory containing the symlink, if necessary.
    //
    // FIXME: Shared behavior with ExternalCommand.
    {
      auto parent = llvm::sys::path::parent_path(outputPath);
      if (!parent.empty()) {
        (void) fs.createDirectories(parent);
      }
    }

    // Create the symbolic link (note that despite the poorly chosen LLVM
    // name, this is a symlink).
    system.getDelegate().commandStarted(this);
    auto success = true;
    if (!fs.createSymlink(contents, outputPath.str())) {
      // On failure, we attempt to unlink the file and retry.
      fs.remove(outputPath.str());

      if (!fs.createSymlink(contents, outputPath.str())) {
        getBuildSystem(ti).getDelegate().commandHadError(this,
                       "unable to create symlink at '" + outputPath.str() + "'");
        success = false;
      }
    }
    system.getDelegate().commandFinished(this, success ? ProcessStatus::Succeeded : ProcessStatus::Failed);
    
    // Process the result.
    if (!success) {
      resultFn(BuildValue::makeFailedCommand());
      return;
    }

    // Capture the *link* information of the output.
    FileInfo outputInfo = fs.getLinkInfo(outputPath);
      
    // Complete with a successful result.
    resultFn(BuildValue::makeSuccessfulCommand(outputInfo));
  }